

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f2c.c
# Opt level: O0

Boolean f2c_push_get_(Integer *datatype,Integer *nelem,char *name,Integer *memhandle,
                     MA_AccessIndex *index,int namesize)

{
  Boolean BVar1;
  char *in_RDX;
  long *in_R8;
  int in_R9D;
  char buf [32];
  Boolean value;
  MA_AccessIndex *in_stack_ffffffffffffffa8;
  Integer *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  Integer in_stack_ffffffffffffffc0;
  Integer in_stack_ffffffffffffffc8;
  
  ga_f2cstring(in_RDX,in_R9D,&stack0xffffffffffffffa8,0x20);
  BVar1 = MA_push_get(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                      in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  *in_R8 = *in_R8 + 1;
  return BVar1;
}

Assistant:

FATR f2c_push_get_(datatype, nelem, name, memhandle, index, namesize)
    Integer *datatype;
    Integer *nelem;
    char    *name;
    Integer *memhandle;
    MA_AccessIndex *index;
    int  namesize;    /* implicitly passed by FORTRAN */
#else /* F2C_HIDDEN_STRING_LENGTH_AFTER_ARGS */
public Boolean FATR f2c_push_get_(datatype, nelem, name, namesize, memhandle, index)
    Integer *datatype;
    Integer *nelem;
    char    *name;
    int  namesize;    /* implicitly passed by FORTRAN */
    Integer *memhandle;
    MA_AccessIndex *index;
#endif /* F2C_HIDDEN_STRING_LENGTH_AFTER_ARGS */
{
    Boolean    value;
    char    buf[MA_NAMESIZE];

    /* ensure that name is NUL-terminated */
    ga_f2cstring(name, namesize, buf, (Integer)sizeof(buf));

    value = MA_push_get(*datatype, *nelem, buf, memhandle, index);

    /* FORTRAN array indexing is 1-based, so increment index */
    (*index)++;

    return value;
}